

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::verify_block_hashes(torrent *this,piece_index_t index)

{
  int iVar1;
  
  need_hash_picker(this);
  if ((this->super_torrent_hot_members).m_hash_picker._M_t.
      super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl !=
      (hash_picker *)0x0) {
    iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar1 != '\0') {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"Piece %d hash failure, requesting block hashes",index.m_val);
    }
    hash_picker::verify_block_hashes
              ((this->super_torrent_hot_members).m_hash_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl,index);
    return;
  }
  return;
}

Assistant:

void torrent::verify_block_hashes(piece_index_t index)
	{
		need_hash_picker();
		if (!m_hash_picker) return;
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("Piece %d hash failure, requesting block hashes", int(index));
		}
#endif
		m_hash_picker->verify_block_hashes(index);
	}